

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void SSL_get0_peer_application_settings(SSL *ssl,uint8_t **out_data,size_t *out_len)

{
  uchar *puVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  Span<const_unsigned_char> settings;
  SSL_SESSION *session;
  size_t *out_len_local;
  uint8_t **out_data_local;
  SSL *ssl_local;
  
  settings.size_ = (size_t)SSL_get_session((SSL *)ssl);
  if ((SSL_SESSION *)settings.size_ == (SSL_SESSION *)0x0) {
    bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_38);
  }
  else {
    bssl::Span<unsigned_char_const>::
    Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)local_38,
               (Array<unsigned_char> *)&((SSL_SESSION *)settings.size_)->sess_cert);
  }
  puVar1 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_38);
  *out_data = puVar1;
  sVar2 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_38);
  *out_len = sVar2;
  return;
}

Assistant:

void SSL_get0_peer_application_settings(const SSL *ssl,
                                        const uint8_t **out_data,
                                        size_t *out_len) {
  const SSL_SESSION *session = SSL_get_session(ssl);
  Span<const uint8_t> settings =
      session ? session->peer_application_settings : Span<const uint8_t>();
  *out_data = settings.data();
  *out_len = settings.size();
}